

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Generators<unary_op_tuple<trng::optimized_impl::uint128,_float>_> * __thiscall
Catch::Generators::
makeGenerators<unary_op_tuple<trng::optimized_impl::uint128,float>,unary_op_tuple<trng::optimized_impl::uint128,float>,unary_op_tuple<trng::optimized_impl::uint128,float>>
          (Generators<unary_op_tuple<trng::optimized_impl::uint128,_float>_> *__return_storage_ptr__
          ,Generators *this,unary_op_tuple<trng::optimized_impl::uint128,_float> *val,
          unary_op_tuple<trng::optimized_impl::uint128,_float> *moreGenerators,
          unary_op_tuple<trng::optimized_impl::uint128,_float> *moreGenerators_1)

{
  long lVar1;
  long lVar2;
  long lVar3;
  pointer *__ptr;
  GeneratorWrapper<unary_op_tuple<trng::optimized_impl::uint128,_float>_> local_28;
  
  local_28.m_generator._M_t.
  super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_>_>
  .
  super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_>_>
        )operator_new(0x30);
  *(undefined ***)
   local_28.m_generator._M_t.
   super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_>_>
   .
   super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_*,_false>
   ._M_head_impl = &PTR__GeneratorUntypedBase_0031b208;
  lVar1 = *(long *)(this + 8);
  lVar2 = *(long *)(this + 0x10);
  lVar3 = *(long *)(this + 0x18);
  *(long *)((long)local_28.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_*,_false>
                  ._M_head_impl + 0x10) = *(long *)this;
  *(long *)((long)local_28.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_*,_false>
                  ._M_head_impl + 0x18) = lVar1;
  *(long *)((long)local_28.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_*,_false>
                  ._M_head_impl + 0x20) = lVar2;
  *(long *)((long)local_28.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_*,_false>
                  ._M_head_impl + 0x28) = lVar3;
  Generators<unary_op_tuple<trng::optimized_impl::uint128,float>>::
  Generators<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::optimized_impl::uint128,float>>,unary_op_tuple<trng::optimized_impl::uint128,float>,unary_op_tuple<trng::optimized_impl::uint128,float>>
            ((Generators<unary_op_tuple<trng::optimized_impl::uint128,float>> *)
             __return_storage_ptr__,&local_28,val,moreGenerators);
  if (local_28.m_generator._M_t.
      super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_>_>
      .
      super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_28.m_generator._M_t.
                          super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_>_>
                          .
                          super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::optimized_impl::uint128,_float>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }